

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssw.c
# Opt level: O1

uint32_t * add_cigar(uint32_t *new_cigar,int32_t *p,int32_t *s,uint32_t length,char op)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  
  uVar3 = *s;
  if ((int)uVar3 <= *p) {
    uVar3 = (int)uVar3 >> 1 | uVar3;
    uVar3 = (int)uVar3 >> 2 | uVar3;
    uVar3 = (int)uVar3 >> 4 | uVar3;
    uVar3 = (int)uVar3 >> 8 | uVar3;
    uVar3 = (int)uVar3 >> 0x10 | uVar3;
    *s = uVar3 + 1;
    new_cigar = (uint32_t *)realloc(new_cigar,(long)(int)uVar3 * 4 + 4);
  }
  bVar1 = ""[op];
  iVar2 = *p;
  *p = iVar2 + 1;
  new_cigar[iVar2] = (uint)bVar1 | length << 4;
  return new_cigar;
}

Assistant:

uint32_t* add_cigar (uint32_t* new_cigar, int32_t* p, int32_t* s, uint32_t length, char op) {
	if ((*p) >= (*s)) {
		++(*s);
		kroundup32(*s);
		new_cigar = (uint32_t*)realloc(new_cigar, (*s)*sizeof(uint32_t));
	}
	new_cigar[(*p) ++] = to_cigar_int(length, op);
	return new_cigar;
}